

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

ssize_t __thiscall amrex::FluxRegister::write(FluxRegister *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ostream *poVar2;
  ssize_t sVar3;
  BndryRegister *br;
  
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    poVar2 = amrex::operator<<((ostream *)this,(IntVect *)0x1066b0c);
    std::operator<<(poVar2,'\n');
    poVar2 = (ostream *)std::ostream::operator<<(__buf,this->fine_level);
    std::operator<<(poVar2,'\n');
    poVar2 = (ostream *)std::ostream::operator<<(__buf,this->ncomp);
    std::operator<<(poVar2,'\n');
  }
  sVar3 = BndryRegister::write(&this->super_BndryRegister,__fd,__buf,__n);
  return sVar3;
}

Assistant:

void
FluxRegister::write (const std::string& name, std::ostream& os) const
{
    if (ParallelDescriptor::IOProcessor())
    {
        os << ratio      << '\n';
        os << fine_level << '\n';
        os << ncomp      << '\n';
    }

    const BndryRegister* br = this;

    br->write(name,os);
}